

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

bool __thiscall
despot::util::tinyxml::TiXmlDocument::LoadFile
          (TiXmlDocument *this,FILE *file,TiXmlEncoding encoding)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *local_68;
  char *p;
  char *lastPos;
  char *buf;
  TiXmlString local_38;
  TiXmlString data;
  long length;
  TiXmlEncoding encoding_local;
  FILE *file_local;
  TiXmlDocument *this_local;
  
  if (file == (FILE *)0x0) {
    SetError(this,2,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
    this_local._7_1_ = false;
  }
  else {
    TiXmlNode::Clear(&this->super_TiXmlNode);
    TiXmlCursor::Clear(&(this->super_TiXmlNode).super_TiXmlBase.location);
    data.rep_ = (Rep *)0x0;
    fseek((FILE *)file,0,2);
    data.rep_ = (Rep *)ftell((FILE *)file);
    fseek((FILE *)file,0,0);
    if ((long)data.rep_ < 1) {
      SetError(this,0xd,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
      this_local._7_1_ = false;
    }
    else {
      TiXmlString::TiXmlString(&local_38);
      TiXmlString::reserve(&local_38,(size_type)data.rep_);
      pcVar2 = (char *)operator_new__((ulong)((long)&(data.rep_)->size + 1));
      *pcVar2 = '\0';
      sVar3 = fread(pcVar2,(size_t)data.rep_,1,(FILE *)file);
      if (sVar3 == 1) {
        pcVar2[(long)data.rep_] = '\0';
        local_68 = pcVar2;
        p = pcVar2;
        while (*local_68 != '\0') {
          if (pcVar2 + (long)data.rep_ <= local_68) {
            __assert_fail("p < (buf + length)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                          ,0x36c,
                          "bool despot::util::tinyxml::TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)"
                         );
          }
          if (*local_68 == '\n') {
            TiXmlString::append(&local_38,p,(size_type)(local_68 + (1 - (long)p)));
            local_68 = local_68 + 1;
            p = local_68;
            if (pcVar2 + (long)data.rep_ < local_68) {
              __assert_fail("p <= (buf + length)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                            ,0x373,
                            "bool despot::util::tinyxml::TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)"
                           );
            }
          }
          else if (*local_68 == '\r') {
            if (0 < (long)local_68 - (long)p) {
              TiXmlString::append(&local_38,p,(long)local_68 - (long)p);
            }
            TiXmlString::operator+=(&local_38,'\n');
            if (local_68[1] == '\n') {
              local_68 = local_68 + 2;
              p = local_68;
              if (pcVar2 + (long)data.rep_ < local_68) {
                __assert_fail("p <= (buf + length)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                              ,0x380,
                              "bool despot::util::tinyxml::TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)"
                             );
              }
            }
            else {
              local_68 = local_68 + 1;
              p = local_68;
              if (pcVar2 + (long)data.rep_ < local_68) {
                __assert_fail("p <= (buf + length)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                              ,0x385,
                              "bool despot::util::tinyxml::TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)"
                             );
              }
            }
          }
          else {
            local_68 = local_68 + 1;
          }
        }
        if (local_68 != p) {
          TiXmlString::append(&local_38,p,(long)local_68 - (long)p);
        }
        if (pcVar2 != (char *)0x0) {
          operator_delete__(pcVar2);
        }
        pcVar2 = TiXmlString::c_str(&local_38);
        (*(this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase[3])(this,pcVar2,0,(ulong)encoding)
        ;
        bVar1 = Error(this);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        if (pcVar2 != (char *)0x0) {
          operator_delete__(pcVar2);
        }
        SetError(this,2,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
        this_local._7_1_ = false;
      }
      TiXmlString::~TiXmlString(&local_38);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TiXmlDocument::LoadFile(FILE* file, TiXmlEncoding encoding) {
	if (!file) {
		SetError(TIXML_ERROR_OPENING_FILE, 0, 0, TIXML_ENCODING_UNKNOWN);
		return false;
	}

	// Delete the existing data:
	Clear();
	location.Clear();

	// Get the file size, so we can pre-allocate the string. HUGE speed impact.
	long length = 0;
	fseek(file, 0, SEEK_END);
	length = ftell(file);
	fseek(file, 0, SEEK_SET);

	// Strange case, but good to handle up front.
	if (length <= 0) {
		SetError(TIXML_ERROR_DOCUMENT_EMPTY, 0, 0, TIXML_ENCODING_UNKNOWN);
		return false;
	}
	// If we have a file, assume it is all one big XML file, and read it in.
	// The document parser may decide the document ends sooner than the entire file, however.
	TIXML_STRING data;
	data.reserve(length);

	// Subtle bug here. TinyXml did use fgets. But from the XML spec:
	// 2.11 End-of-Line Handling
	// <snip>
	// <quote>
	// ...the XML processor MUST behave as if it normalized all line breaks in external
	// parsed entities (including the document entity) on input, before parsing, by translating
	// both the two-character sequence #xD #xA and any #xD that is not followed by #xA to
	// a single #xA character.
	// </quote>
	//
	// It is not clear fgets does that, and certainly isn't clear it works cross platform.
	// Generally, you expect fgets to translate from the convention of the OS to the c/unix
	// convention, and not work generally.

	/*
	 while( fgets( buf, sizeof(buf), file ) )
	 {
	 data += buf;
	 }
	 */

	char* buf = new char[length + 1];
	buf[0] = 0;

	if (fread(buf, length, 1, file) != 1) {
		delete[] buf;
		SetError(TIXML_ERROR_OPENING_FILE, 0, 0, TIXML_ENCODING_UNKNOWN);
		return false;
	}

	const char* lastPos = buf;
	const char* p = buf;

	buf[length] = 0;
	while (*p) {
		assert(p < (buf + length));
		if (*p == 0xa) {
			// Newline character. No special rules for this. Append all the characters
			// since the last string, and include the newline.
			data.append(lastPos, (p - lastPos + 1)); // append, include the newline
			++p; // move past the newline
			lastPos = p; // and point to the new buffer (may be 0)
			assert(p <= (buf + length));
		} else if (*p == 0xd) {
			// Carriage return. Append what we have so far, then
			// handle moving forward in the buffer.
			if ((p - lastPos) > 0) {
				data.append(lastPos, p - lastPos); // do not add the CR
			}
			data += (char) 0xa; // a proper newline

			if (*(p + 1) == 0xa) {
				// Carriage return - new line sequence
				p += 2;
				lastPos = p;
				assert(p <= (buf + length));
			} else {
				// it was followed by something else...that is presumably characters again.
				++p;
				lastPos = p;
				assert(p <= (buf + length));
			}
		} else {
			++p;
		}
	}
	// Handle any left over characters.
	if (p - lastPos) {
		data.append(lastPos, p - lastPos);
	}
	delete[] buf;
	buf = 0;

	Parse(data.c_str(), 0, encoding);

	if (Error())
		return false;
	else
		return true;
}